

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

void * rw::copyHAnim(void *dst,void *src,int32 offset,int32 param_4)

{
  int iVar1;
  uint *puVar2;
  HAnimNodeInfo *pHVar3;
  long lVar4;
  HAnimHierarchy *pHVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = (long)offset;
  *(undefined4 *)((long)dst + lVar7) = *(undefined4 *)((long)src + lVar7);
  *(undefined8 *)((long)dst + lVar7 + 8) = 0;
  puVar2 = *(uint **)((long)src + lVar7 + 8);
  if ((puVar2 != (uint *)0x0) && ((*puVar2 & 1) == 0)) {
    pHVar5 = HAnimHierarchy::create
                       (puVar2[1],(int32 *)0x0,(int32 *)0x0,*puVar2,
                        *(int32 *)(*(long *)(puVar2 + 0xc) + 0x18));
    iVar1 = pHVar5->numNodes;
    if (0 < (long)iVar1) {
      pHVar3 = pHVar5->nodeInfo;
      lVar4 = *(long *)(puVar2 + 6);
      lVar6 = 0;
      do {
        *(undefined8 *)((long)&pHVar3->frame + lVar6) = 0;
        *(undefined4 *)((long)&pHVar3->flags + lVar6) = *(undefined4 *)(lVar4 + 8 + lVar6);
        *(undefined4 *)((long)&pHVar3->index + lVar6) = *(undefined4 *)(lVar4 + 4 + lVar6);
        *(undefined4 *)((long)&pHVar3->id + lVar6) = *(undefined4 *)(lVar4 + lVar6);
        lVar6 = lVar6 + 0x18;
      } while ((long)iVar1 * 0x18 != lVar6);
    }
    *(HAnimHierarchy **)((long)dst + lVar7 + 8) = pHVar5;
    pHVar5->parentFrame = (Frame *)dst;
  }
  return dst;
}

Assistant:

static void*
copyHAnim(void *dst, void *src, int32 offset, int32)
{
	int i;
	HAnimData *dsthanim = PLUGINOFFSET(HAnimData, dst, offset);
	HAnimData *srchanim = PLUGINOFFSET(HAnimData, src, offset);
	HAnimHierarchy *srchier, *dsthier;
	dsthanim->id = srchanim->id;
	dsthanim->hierarchy = nil;
	srchier = srchanim->hierarchy;
	if(srchier && !(srchier->flags & HAnimHierarchy::SUBHIERARCHY)){
		dsthier = HAnimHierarchy::create(srchier->numNodes, nil, nil, srchier->flags, srchier->interpolator->maxInterpKeyFrameSize);
		for(i = 0; i < dsthier->numNodes; i++){
			dsthier->nodeInfo[i].frame = nil;
			dsthier->nodeInfo[i].flags = srchier->nodeInfo[i].flags;
			dsthier->nodeInfo[i].index = srchier->nodeInfo[i].index;
			dsthier->nodeInfo[i].id = srchier->nodeInfo[i].id;
		}
		dsthanim->hierarchy = dsthier;
		dsthier->parentFrame = (Frame*)dst;
	}
	return dst;
}